

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  DataKey *pDVar2;
  _func_int **pp_Var3;
  Real RVar4;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale_00;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale_01;
  DataArray<int> perm_00;
  undefined1 auVar5 [16];
  DataArray<int> perm_01;
  DataArray<bool> isLhsEqualRhs_00;
  DataArray<bool> isLhsEqualRhs_01;
  shared_ptr<soplex::Tolerances> tols;
  shared_ptr<soplex::Tolerances> tols_00;
  fpclass_type *pfVar6;
  type_conflict5 tVar7;
  bool bVar8;
  bool bVar9;
  int k_tmp;
  SPxOut *pSVar10;
  ulong uVar11;
  pointer pDVar12;
  double *pdVar13;
  DuplicateRowsPS *pDVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ElementCompare *pEVar20;
  pointer pnVar21;
  int i;
  int iVar22;
  long lVar23;
  int iVar24;
  uint *puVar25;
  Verbosity *pVVar26;
  ulong uVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  _func_int **pp_Var29;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  *psVar30;
  ElementCompare *pEVar31;
  pointer pnVar32;
  int **ppiVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  Verbosity *pVVar35;
  undefined4 *puVar36;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar37;
  Item *pIVar38;
  int *piVar39;
  ulong uVar40;
  ulong uVar41;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *dupRows;
  uint n;
  long lVar42;
  long lVar43;
  byte bVar44;
  undefined8 uVar45;
  undefined4 in_stack_fffffffffffff408;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar46;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar47;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *__x;
  Item *pIVar48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__x_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var49;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar50;
  int *perm_tmp;
  int local_bc0;
  int local_bbc;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_bb8;
  int *idxMem;
  Result local_ba8;
  int remRows;
  long local_ba0;
  IdxSet idxSet;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int iStack_b08;
  bool bStack_b04;
  undefined8 local_b00;
  int *perm;
  uint auStack_ac0 [25];
  undefined3 uStack_a5b;
  int iStack_a58;
  bool bStack_a54;
  undefined8 local_a50;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> pClass;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a18;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_990;
  ulong local_988;
  DataArray<int> classSize;
  undefined1 local_968 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_960;
  uint local_958 [23];
  undefined3 uStack_8fb;
  int iStack_8f8;
  bool bStack_8f4;
  undefined8 local_8f0;
  bool *local_8e0;
  ulong local_8d8;
  Tolerances *local_8d0;
  DataArray<bool> isLhsEqualRhs;
  DataArray<bool> remRow;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  ElementCompare compare;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_760;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_750;
  undefined1 local_740 [48];
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_710;
  undefined1 local_6f8 [48];
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_6c8;
  undefined1 local_6b0 [128];
  Verbosity old_verbosity;
  int local_5c0;
  bool local_5bc;
  fpclass_type local_5b8;
  int32_t iStack_5b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar44 = 0;
  remRows = 0;
  local_8d0 = (Tolerances *)
              (long)(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
  local_ba8 = removeEmpty(this,lp);
  if (local_ba8 == OKAY) {
    iVar22 = 0;
    local_8e0 = again;
    for (old_verbosity = ERROR;
        iVar24 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum, (int)old_verbosity < iVar24; old_verbosity = old_verbosity + WARNING)
    {
      pIVar38 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      iVar24 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[(int)old_verbosity].idx;
      if (pIVar38[iVar24].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 1) {
        removeRowSingleton(this,lp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)(pIVar38 + iVar24),(int *)&old_verbosity);
        iVar22 = iVar22 + 1;
      }
    }
    if (((0 < iVar22) &&
        (pSVar10 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout, pSVar10 != (SPxOut *)0x0)) && (3 < (int)pSVar10->m_verbosity)) {
      compare.epsiloncompare.m_backend.data._M_elems[0] = 4;
      old_verbosity = pSVar10->m_verbosity;
      (*pSVar10->_vptr_SPxOut[2])();
      pSVar10 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,
                                   "Simplifier duplicate rows (row singleton stage) removed ");
      pSVar10 = soplex::operator<<(pSVar10,iVar22);
      pSVar10 = soplex::operator<<(pSVar10," rows, ");
      pSVar10 = soplex::operator<<(pSVar10,iVar22);
      pSVar10 = soplex::operator<<(pSVar10," non-zeros");
      std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
      pSVar10 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar10->_vptr_SPxOut[2])(pSVar10,&old_verbosity);
      iVar24 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
    }
    local_ba8 = OKAY;
    if (1 < iVar24) {
      DataArray<int>::DataArray(&pClass,iVar24,0,1.2);
      pSVar46 = lp;
      DataArray<int>::DataArray
                (&classSize,
                 (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum,0,1.2);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      idxSet.len = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
      idxSet._vptr_IdxSet = (_func_int **)&PTR__IdxSet_0053d170;
      idxSet.num = 0;
      idxSet.idx = idxMem;
      idxSet.freeArray = false;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      iVar22 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      *classSize.data = iVar22;
      lVar42 = 0x80;
      for (lVar23 = 1; lVar23 < iVar22; lVar23 = lVar23 + 1) {
        pClass.data[lVar23] = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((long)((scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar42),0.0);
        classSize.data[lVar23] = 0;
        lVar15 = (long)idxSet.num;
        idxSet.num = idxSet.num + 1;
        idxSet.idx[lVar15] = (int)lVar23;
        iVar22 = (pSVar46->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        lVar42 = lVar42 + 0x80;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
      local_bb8 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
      local_ba8 = INFEASIBLE;
      lVar23 = 0;
      pSVar50 = this;
      while (lVar23 < (pSVar46->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum) {
        pIVar38 = (pSVar46->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (pSVar46->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar23].idx;
        lVar15 = 0;
        lVar42 = 0;
        local_ba0 = lVar23;
        while( true ) {
          lVar23 = 0x1c;
          uVar11 = (ulong)(pIVar38->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
          if ((long)uVar11 <= lVar42) break;
          pNVar1 = (pIVar38->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          puVar25 = (uint *)((long)(pNVar1->val).m_backend.data._M_elems + lVar15);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)&compare;
          for (; lVar23 != 0; lVar23 = lVar23 + -1) {
            (pcVar28->data)._M_elems[0] = *puVar25;
            puVar25 = puVar25 + (ulong)bVar44 * -2 + 1;
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar44 * -8 + 4);
          }
          compare.epsiloncompare.m_backend.exp =
               *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar15);
          compare.epsiloncompare.m_backend.neg =
               *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar15 + 4);
          compare.epsiloncompare.m_backend._120_8_ =
               *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar15 + 8);
          iVar22 = *(int *)((long)(&((pIVar38->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar15);
          local_968 = (undefined1  [8])0x0;
          tVar7 = boost::multiprecision::operator==
                            (scale.data.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + iVar22,(double *)local_968)
          ;
          if (tVar7) {
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)&compare;
            pnVar21 = scale.data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar22;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pnVar21->m_backend).data._M_elems[0] = (pcVar28->data)._M_elems[0];
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar44 * -8 + 4);
              pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar44 * -2 + 1) * 4);
            }
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar22].m_backend.exp =
                 compare.epsiloncompare.m_backend.exp;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar22].m_backend.neg =
                 compare.epsiloncompare.m_backend.neg;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar22].m_backend.fpclass =
                 compare.epsiloncompare.m_backend.fpclass;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar22].m_backend.prec_elem =
                 compare.epsiloncompare.m_backend.prec_elem;
          }
          iVar24 = pClass.data[iVar22];
          pDVar12 = (pSVar50->m_classSetRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_8f0._0_4_ = cpp_dec_float_finite;
          local_8f0._4_4_ = 0x1c;
          local_968 = (undefined1  [8])0x0;
          _Stack_960._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_958[0] = 0;
          local_958[1] = 0;
          local_958[2] = 0;
          local_958[3] = 0;
          local_958[4] = 0;
          local_958[5] = 0;
          local_958[6] = 0;
          local_958[7] = 0;
          local_958[8] = 0;
          local_958[9] = 0;
          local_958[10] = 0;
          local_958[0xb] = 0;
          local_958[0xc] = 0;
          local_958[0xd] = 0;
          local_958[0xe] = 0;
          local_958[0xf] = 0;
          local_958[0x10] = 0;
          local_958[0x11] = 0;
          local_958[0x12] = 0;
          local_958[0x13] = 0;
          local_958[0x14] = 0;
          local_958[0x15] = 0;
          stack0xfffffffffffff700 = 0;
          uStack_8fb = 0;
          iStack_8f8 = 0;
          bStack_8f4 = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)local_968,
                     (cpp_dec_float<200U,_int,_void> *)&compare,
                     &scale.data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar22].m_backend);
          this = pSVar50;
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar12 + iVar24,iVar22,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_968);
          piVar39 = classSize.data + pClass.data[iVar22];
          *piVar39 = *piVar39 + -1;
          if (*piVar39 == 0) {
            lVar23 = (long)idxSet.num;
            idxSet.num = idxSet.num + 1;
            idxSet.idx[lVar23] = pClass.data[iVar22];
          }
          lVar42 = lVar42 + 1;
          lVar15 = lVar15 + 0x84;
          pSVar50 = this;
        }
        pIVar48 = pIVar38;
        for (lVar23 = 0; lVar23 < (int)uVar11; lVar23 = lVar23 + 1) {
          lVar42 = (long)pClass.data
                         [(pIVar38->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem[lVar23].idx] * 0x20;
          if (0 < (this->m_classSetRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [pClass.data
                   [(pIVar38->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem[lVar23].idx]].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_968,
                       local_bb8);
            RVar4 = Tolerances::epsilon((Tolerances *)local_968);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&local_130,RVar4,(type *)0x0);
            ElementCompare::ElementCompare
                      (&compare,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_130);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_960);
            pDVar12 = (this->m_classSetRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar22 = *(int *)((long)&(pDVar12->
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).memused + lVar42);
            pIVar38 = pIVar48;
            if (1 < iVar22) {
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (*(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           **)((long)&(pDVar12->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).m_elem + lVar42),iVar22,&compare,0,true);
              pDVar12 = (this->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pIVar38 = pIVar48;
            }
            iVar22 = *idxSet.idx;
            lVar15 = (long)idxSet.num;
            idxSet.num = idxSet.num + -1;
            *idxSet.idx = idxSet.idx[lVar15 + -1];
            lVar43 = 0;
            lVar15 = 0;
            while( true ) {
              lVar17 = 0x1c;
              if (*(int *)((long)&(pDVar12->
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).memused + lVar42) <= lVar15) break;
              if (lVar43 != 0) {
                lVar18 = *(long *)((long)&(pDVar12->
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).m_elem + lVar42);
                puVar25 = (uint *)(lVar18 + lVar43);
                pnVar34 = &local_230;
                for (lVar16 = lVar17; lVar16 != 0; lVar16 = lVar16 + -1) {
                  (pnVar34->m_backend).data._M_elems[0] = *puVar25;
                  puVar25 = puVar25 + (ulong)bVar44 * -2 + 1;
                  pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
                }
                local_230.m_backend.exp = *(int *)(lVar18 + 0x70 + lVar43);
                local_230.m_backend.neg = (bool)*(undefined1 *)(lVar18 + 0x74 + lVar43);
                local_230.m_backend._120_8_ = *(undefined8 *)(lVar18 + 0x78 + lVar43);
                pVVar26 = &old_verbosity;
                pnVar34 = &local_2b0;
                for (; lVar17 != 0; lVar17 = lVar17 + -1) {
                  (pnVar34->m_backend).data._M_elems[0] = *pVVar26;
                  pVVar26 = pVVar26 + (ulong)bVar44 * -2 + 1;
                  pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
                }
                local_2b0.m_backend.exp = local_5c0;
                local_2b0.m_backend.neg = local_5bc;
                local_2b0.m_backend.fpclass = local_5b8;
                local_2b0.m_backend.prec_elem = iStack_5b4;
                epsZero(&local_b0,this);
                bVar8 = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_230,&local_2b0,&local_b0);
                if (bVar8) {
                  iVar22 = *idxSet.idx;
                  lVar17 = (long)idxSet.num;
                  idxSet.num = idxSet.num + -1;
                  *idxSet.idx = idxSet.idx[lVar17 + -1];
                }
              }
              pDVar12 = (this->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar17 = *(long *)((long)&(pDVar12->
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).m_elem + lVar42);
              pClass.data[*(int *)(lVar17 + 0x80 + lVar43)] = iVar22;
              classSize.data[iVar22] = classSize.data[iVar22] + 1;
              pVVar26 = (Verbosity *)(lVar17 + lVar43);
              pVVar35 = &old_verbosity;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                *pVVar35 = *pVVar26;
                pVVar26 = pVVar26 + (ulong)bVar44 * -2 + 1;
                pVVar35 = pVVar35 + (ulong)bVar44 * -2 + 1;
              }
              local_5c0 = *(int *)(lVar17 + 0x70 + lVar43);
              local_5bc = (bool)*(undefined1 *)(lVar17 + 0x74 + lVar43);
              _local_5b8 = *(undefined8 *)(lVar17 + 0x78 + lVar43);
              lVar15 = lVar15 + 1;
              lVar43 = lVar43 + 0x84;
            }
            *(undefined4 *)
             ((long)&(pDVar12->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).memused + lVar42) = 0;
            uVar11 = (ulong)(uint)(pIVar38->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .memused;
            pIVar48 = pIVar38;
          }
        }
        lVar23 = local_ba0 + 1;
      }
      pSVar47 = pSVar46;
      free(idxMem);
      idxMem = (int *)0x0;
      lVar23 = 0;
      DataArray<bool>::DataArray
                (&remRow,(pSVar46->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum,0,1.2);
      n = (pSVar46->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
      pDVar12 = (this->m_dupRows).data.
                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = 0;
      if (0 < (int)n) {
        uVar11 = (ulong)n;
      }
      for (; uVar11 * 0x20 != lVar23; lVar23 = lVar23 + 0x20) {
        *(undefined4 *)
         ((long)&(pDVar12->
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).memused + lVar23) = 0;
      }
      for (lVar23 = 0; lVar23 < (int)n; lVar23 = lVar23 + 1) {
        remRow.data[lVar23] = false;
        iVar22 = pClass.data[lVar23];
        pDVar12 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)&compare,0.0,(type *)0x0);
        this = pSVar50;
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(pDVar12 + iVar22,(int)lVar23,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&compare);
        n = (pSVar47->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        pSVar50 = this;
      }
      perm_tmp = (int *)0x0;
      spx_alloc<int*>(&perm_tmp,n);
      uVar11 = 0;
      uVar19 = 0;
      if (0 < (int)n) {
        uVar19 = (ulong)n;
      }
      for (; uVar19 != uVar11; uVar11 = uVar11 + 1) {
        perm_tmp[uVar11] = 0;
      }
      pDVar12 = (this->m_dupRows).data.
                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar38 = (pSVar47->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      pDVar2 = (pSVar47->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      uVar11 = 0xffffffffffffffff;
      uVar40 = 0xffffffff;
      for (uVar27 = 0;
          (long)uVar27 <
          (long)(pSVar47->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; uVar27 = uVar27 + 1) {
        iVar22 = pDVar12[uVar27].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        if (1 < iVar22) {
          pNVar1 = pDVar12[uVar27].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          if (pIVar38[pDVar2[pNVar1->idx].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused != 1) {
            piVar39 = &pNVar1[1].idx;
            for (lVar23 = 1; lVar23 < iVar22; lVar23 = lVar23 + 1) {
              perm_tmp[*piVar39] = -1;
              iVar22 = pDVar12[uVar27].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
              piVar39 = piVar39 + 0x21;
            }
            if ((int)uVar11 < 0) {
              uVar11 = uVar27;
            }
            uVar11 = uVar11 & 0xffffffff;
            uVar40 = uVar27 & 0xffffffff;
          }
        }
      }
      iVar22 = 0;
      for (uVar27 = 0; uVar19 != uVar27; uVar27 = uVar27 + 1) {
        if (-1 < perm_tmp[uVar27]) {
          perm_tmp[uVar27] = iVar22;
          iVar22 = iVar22 + 1;
        }
      }
      __x_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               &(pSVar47->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left;
      pSVar46 = pSVar47;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newLhsVec.val,
               (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)__x_00);
      __x = &(pSVar47->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newRhsVec.val,&__x->val);
      local_990 = &this->m_hist;
      local_8d8 = uVar11 & 0xffffffff;
      bVar8 = false;
      local_988 = uVar40;
      for (uVar27 = 0;
          uVar41 = (ulong)(pSVar46->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum, (long)uVar27 < (long)uVar41; uVar27 = uVar27 + 1) {
        pDVar12 = (this->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar22 = pDVar12[uVar27].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        if ((1 < iVar22) &&
           ((pSVar46->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem
            [(pSVar46->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey
             [(pDVar12[uVar27].
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem)->idx].idx].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused != 1)) {
          piVar39 = (this->m_stat).data;
          piVar39[0xc] = iVar22 + piVar39[0xc] + -1;
          pdVar13 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)&compare,-*pdVar13,(type *)0x0);
          pdVar13 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)&perm,*pdVar13,(type *)0x0);
          pcVar28 = (cpp_dec_float<200U,_int,_void> *)&perm;
          puVar25 = (uint *)local_968;
          for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
            *puVar25 = (pcVar28->data)._M_elems[0];
            pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar44 * -8 + 4);
            puVar25 = puVar25 + (ulong)bVar44 * -2 + 1;
          }
          iStack_8f8 = iStack_a58;
          bStack_8f4 = bStack_a54;
          local_8f0._0_4_ = (fpclass_type)local_a50;
          local_8f0._4_4_ = local_a50._4_4_;
          DataArray<bool>::DataArray
                    (&isLhsEqualRhs,
                     (this->m_dupRows).data.
                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar27].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused,0,1.2);
          lVar23 = 0x80;
          lVar42 = 0;
          local_bc0 = -1;
          iVar22 = local_bc0;
          local_bbc = local_bc0;
          local_ba0 = uVar27 * 0x20;
          while( true ) {
            lVar15 = local_ba0;
            pDVar12 = (this->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar43 = (long)iVar22;
            if (*(int *)((long)&(pDVar12->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).memused + local_ba0) <= lVar42) break;
            iVar24 = *(int *)(*(long *)((long)&(pDVar12->
                                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               ).m_elem + local_ba0) + lVar23);
            lVar15 = (long)iVar24;
            bVar9 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(__x_00->_vptr__Sp_counted_base + lVar15 * 0x10),
                               (__x->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar15);
            isLhsEqualRhs.data[lVar42] = bVar9;
            if (iVar22 == -1) {
              pp_Var3 = __x_00->_vptr__Sp_counted_base;
              lVar43 = 0x1c;
              pp_Var29 = pp_Var3 + lVar15 * 0x10;
              pEVar20 = &compare;
              for (lVar17 = lVar43; lVar17 != 0; lVar17 = lVar17 + -1) {
                (pEVar20->epsiloncompare).m_backend.data._M_elems[0] = *(uint *)pp_Var29;
                pp_Var29 = (_func_int **)((long)pp_Var29 + ((ulong)bVar44 * -2 + 1) * 4);
                pEVar20 = (ElementCompare *)((long)pEVar20 + ((ulong)bVar44 * -2 + 1) * 4);
              }
              compare.epsiloncompare.m_backend.exp = *(int *)(pp_Var3 + lVar15 * 0x10 + 0xe);
              compare.epsiloncompare.m_backend.neg = *(bool *)((long)pp_Var3 + lVar15 * 0x80 + 0x74)
              ;
              compare.epsiloncompare.m_backend._120_8_ = pp_Var3[lVar15 * 0x10 + 0xf];
              pnVar21 = (__x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar32 = pnVar21 + lVar15;
              puVar36 = (undefined4 *)local_968;
              for (; lVar43 != 0; lVar43 = lVar43 + -1) {
                *puVar36 = (pnVar32->m_backend).data._M_elems[0];
                pnVar32 = (pointer)((long)pnVar32 + ((ulong)bVar44 * -2 + 1) * 4);
                puVar36 = puVar36 + (ulong)bVar44 * -2 + 1;
              }
              iStack_8f8 = pnVar21[lVar15].m_backend.exp;
              bStack_8f4 = pnVar21[lVar15].m_backend.neg;
              local_8f0._0_4_ = pnVar21[lVar15].m_backend.fpclass;
              local_8f0._4_4_ = pnVar21[lVar15].m_backend.prec_elem;
              this = pSVar50;
            }
            else {
              local_a50._0_4_ = cpp_dec_float_finite;
              local_a50._4_4_ = 0x1c;
              perm = (int *)0x0;
              auStack_ac0[0] = 0;
              auStack_ac0[1] = 0;
              auStack_ac0[2] = 0;
              auStack_ac0[3] = 0;
              auStack_ac0[4] = 0;
              auStack_ac0[5] = 0;
              auStack_ac0[6] = 0;
              auStack_ac0[7] = 0;
              auStack_ac0[8] = 0;
              auStack_ac0[9] = 0;
              auStack_ac0[10] = 0;
              auStack_ac0[0xb] = 0;
              auStack_ac0[0xc] = 0;
              auStack_ac0[0xd] = 0;
              auStack_ac0[0x16] = 0;
              auStack_ac0[0x17] = 0;
              stack0xfffffffffffff5a0 = 0;
              uStack_a5b = 0;
              iStack_a58 = 0;
              bStack_a54 = false;
              auStack_ac0[0xe] = 0;
              auStack_ac0[0xf] = 0;
              auStack_ac0[0x10] = 0;
              auStack_ac0[0x11] = 0;
              auStack_ac0[0x12] = 0;
              auStack_ac0[0x13] = 0;
              auStack_ac0[0x14] = 0;
              auStack_ac0[0x15] = 0;
              local_a18.m_backend.fpclass = cpp_dec_float_finite;
              local_a18.m_backend.prec_elem = 0x1c;
              local_a18.m_backend.data._M_elems[0] = 0;
              local_a18.m_backend.data._M_elems[1] = 0;
              local_a18.m_backend.data._M_elems[2] = 0;
              local_a18.m_backend.data._M_elems[3] = 0;
              local_a18.m_backend.data._M_elems[4] = 0;
              local_a18.m_backend.data._M_elems[5] = 0;
              local_a18.m_backend.data._M_elems[6] = 0;
              local_a18.m_backend.data._M_elems[7] = 0;
              local_a18.m_backend.data._M_elems[8] = 0;
              local_a18.m_backend.data._M_elems[9] = 0;
              local_a18.m_backend.data._M_elems[10] = 0;
              local_a18.m_backend.data._M_elems[0xb] = 0;
              local_a18.m_backend.data._M_elems[0xc] = 0;
              local_a18.m_backend.data._M_elems[0xd] = 0;
              local_a18.m_backend.data._M_elems[0xe] = 0;
              local_a18.m_backend.data._M_elems[0xf] = 0;
              local_a18.m_backend.data._M_elems[0x10] = 0;
              local_a18.m_backend.data._M_elems[0x11] = 0;
              local_a18.m_backend.data._M_elems[0x12] = 0;
              local_a18.m_backend.data._M_elems[0x13] = 0;
              local_a18.m_backend.data._M_elems[0x18] = 0;
              local_a18.m_backend.data._M_elems[0x19] = 0;
              local_a18.m_backend.data._M_elems._104_5_ = 0;
              local_a18.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              local_a18.m_backend.exp = 0;
              local_a18.m_backend.neg = false;
              local_a18.m_backend.data._M_elems[0x14] = 0;
              local_a18.m_backend.data._M_elems[0x15] = 0;
              local_a18.m_backend.data._M_elems[0x16] = 0;
              local_a18.m_backend.data._M_elems[0x17] = 0;
              factor.m_backend.fpclass = cpp_dec_float_finite;
              factor.m_backend.prec_elem = 0x1c;
              factor.m_backend.data._M_elems[0] = 0;
              factor.m_backend.data._M_elems[1] = 0;
              factor.m_backend.data._M_elems[2] = 0;
              factor.m_backend.data._M_elems[3] = 0;
              factor.m_backend.data._M_elems[4] = 0;
              factor.m_backend.data._M_elems[5] = 0;
              factor.m_backend.data._M_elems[6] = 0;
              factor.m_backend.data._M_elems[7] = 0;
              factor.m_backend.data._M_elems[8] = 0;
              factor.m_backend.data._M_elems[9] = 0;
              factor.m_backend.data._M_elems[10] = 0;
              factor.m_backend.data._M_elems[0xb] = 0;
              factor.m_backend.data._M_elems[0xc] = 0;
              factor.m_backend.data._M_elems[0xd] = 0;
              factor.m_backend.data._M_elems[0xe] = 0;
              factor.m_backend.data._M_elems[0xf] = 0;
              factor.m_backend.data._M_elems[0x10] = 0;
              factor.m_backend.data._M_elems[0x11] = 0;
              factor.m_backend.data._M_elems[0x12] = 0;
              factor.m_backend.data._M_elems[0x13] = 0;
              factor.m_backend.data._M_elems[0x14] = 0;
              factor.m_backend.data._M_elems[0x15] = 0;
              factor.m_backend.data._M_elems[0x16] = 0;
              factor.m_backend.data._M_elems[0x17] = 0;
              factor.m_backend.data._M_elems[0x18] = 0;
              factor.m_backend.data._M_elems[0x19] = 0;
              factor.m_backend.data._M_elems._104_5_ = 0;
              factor.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              factor.m_backend.exp = 0;
              factor.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&factor.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend);
              ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)
                        ((ulong)ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr & 0xffffffff00000000);
              tVar7 = boost::multiprecision::operator>(&factor,(int *)&ptr);
              if (tVar7) {
                pp_Var3 = __x_00->_vptr__Sp_counted_base;
                pdVar13 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<200U,_int,_void> *)local_6b0,-*pdVar13,(type *)0x0);
                tVar7 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(pp_Var3 + lVar15 * 0x10),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_6b0);
                if (tVar7) {
                  pdVar13 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,-*pdVar13,(type *)0x0);
                }
                else {
                  local_b00._0_4_ = cpp_dec_float_finite;
                  local_b00._4_4_ = 0x1c;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  iStack_b08 = 0;
                  bStack_b04 = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,
                             (cpp_dec_float<200U,_int,_void> *)
                             (__x_00->_vptr__Sp_counted_base + lVar15 * 0x10),&factor.m_backend);
                }
                psVar30 = &ptr;
                ppiVar33 = &perm;
                for (lVar43 = 0x1c; lVar43 != 0; lVar43 = lVar43 + -1) {
                  *(undefined4 *)ppiVar33 =
                       *(undefined4 *)
                        &(psVar30->
                         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                  psVar30 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                             *)((long)psVar30 + (ulong)bVar44 * -8 + 4);
                  ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
                }
                iStack_a58 = iStack_b08;
                bStack_a54 = bStack_b04;
                local_a50._0_4_ = (fpclass_type)local_b00;
                local_a50._4_4_ = local_b00._4_4_;
                pnVar21 = (__x->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pdVar13 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<200U,_int,_void> *)local_6b0,*pdVar13,(type *)0x0);
                tVar7 = boost::multiprecision::operator>=
                                  (pnVar21 + lVar15,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_6b0);
                if (tVar7) {
                  pdVar13 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>((cpp_dec_float<200U,_int,_void> *)&ptr,*pdVar13,(type *)0x0)
                  ;
                }
                else {
                  local_b00._0_4_ = cpp_dec_float_finite;
                  local_b00._4_4_ = 0x1c;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  iStack_b08 = 0;
                  bStack_b04 = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,
                             &(__x->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend,
                             &factor.m_backend);
                }
              }
              else {
                pnVar21 = (__x->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pdVar13 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<200U,_int,_void> *)local_6b0,*pdVar13,(type *)0x0);
                tVar7 = boost::multiprecision::operator>=
                                  (pnVar21 + lVar15,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_6b0);
                if (tVar7) {
                  pdVar13 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,-*pdVar13,(type *)0x0);
                }
                else {
                  local_b00._0_4_ = cpp_dec_float_finite;
                  local_b00._4_4_ = 0x1c;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  iStack_b08 = 0;
                  bStack_b04 = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,
                             &(__x->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend,
                             &factor.m_backend);
                }
                psVar30 = &ptr;
                ppiVar33 = &perm;
                for (lVar43 = 0x1c; lVar43 != 0; lVar43 = lVar43 + -1) {
                  *(undefined4 *)ppiVar33 =
                       *(undefined4 *)
                        &(psVar30->
                         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                  psVar30 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                             *)((long)psVar30 + (ulong)bVar44 * -8 + 4);
                  ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
                }
                iStack_a58 = iStack_b08;
                bStack_a54 = bStack_b04;
                local_a50._0_4_ = (fpclass_type)local_b00;
                local_a50._4_4_ = local_b00._4_4_;
                pp_Var3 = __x_00->_vptr__Sp_counted_base;
                pdVar13 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<200U,_int,_void> *)local_6b0,-*pdVar13,(type *)0x0);
                tVar7 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(pp_Var3 + lVar15 * 0x10),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)local_6b0);
                if (tVar7) {
                  pdVar13 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<double>((cpp_dec_float<200U,_int,_void> *)&ptr,*pdVar13,(type *)0x0)
                  ;
                }
                else {
                  local_b00._0_4_ = cpp_dec_float_finite;
                  local_b00._4_4_ = 0x1c;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  iStack_b08 = 0;
                  bStack_b04 = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,
                             (cpp_dec_float<200U,_int,_void> *)
                             (__x_00->_vptr__Sp_counted_base + lVar15 * 0x10),&factor.m_backend);
                }
              }
              psVar30 = &ptr;
              pnVar34 = &local_a18;
              for (lVar43 = 0x1c; lVar43 != 0; lVar43 = lVar43 + -1) {
                (pnVar34->m_backend).data._M_elems[0] =
                     *(uint *)&(psVar30->
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr;
                psVar30 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                           *)((long)psVar30 + (ulong)bVar44 * -8 + 4);
                pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar34 + (ulong)bVar44 * -8 + 4);
              }
              local_a18.m_backend.exp = iStack_b08;
              local_a18.m_backend.neg = bStack_b04;
              local_a18.m_backend.fpclass = (fpclass_type)local_b00;
              local_a18.m_backend.prec_elem = local_b00._4_4_;
              tVar7 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&perm,&compare.epsiloncompare);
              if (tVar7) {
                ppiVar33 = &perm;
                pEVar20 = &compare;
                for (lVar43 = 0x1c; lVar43 != 0; lVar43 = lVar43 + -1) {
                  (pEVar20->epsiloncompare).m_backend.data._M_elems[0] = *(uint *)ppiVar33;
                  ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
                  pEVar20 = (ElementCompare *)((long)pEVar20 + ((ulong)bVar44 * -2 + 1) * 4);
                }
                compare.epsiloncompare.m_backend.exp = iStack_a58;
                compare.epsiloncompare.m_backend.neg = bStack_a54;
                compare.epsiloncompare.m_backend.fpclass = (fpclass_type)local_a50;
                compare.epsiloncompare.m_backend.prec_elem = local_a50._4_4_;
                local_bbc = iVar24;
              }
              tVar7 = boost::multiprecision::operator<
                                (&local_a18,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_968);
              if (tVar7) {
                pnVar34 = &local_a18;
                puVar25 = (uint *)local_968;
                for (lVar43 = 0x1c; lVar43 != 0; lVar43 = lVar43 + -1) {
                  *puVar25 = (pnVar34->m_backend).data._M_elems[0];
                  pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar34 + (ulong)bVar44 * -8 + 4);
                  puVar25 = puVar25 + (ulong)bVar44 * -2 + 1;
                }
                iStack_8f8 = local_a18.m_backend.exp;
                bStack_8f4 = local_a18.m_backend.neg;
                local_8f0._0_4_ = local_a18.m_backend.fpclass;
                local_8f0._4_4_ = local_a18.m_backend.prec_elem;
                local_bc0 = iVar24;
              }
              remRow.data[lVar15] = true;
              iVar24 = iVar22;
              this = pSVar50;
            }
            lVar42 = lVar42 + 1;
            lVar23 = lVar23 + 0x84;
            iVar22 = iVar24;
            pSVar50 = this;
          }
          if (iVar22 == -1) {
            bVar9 = true;
          }
          else {
            _Var49._M_pi = __x_00;
            tVar7 = boost::multiprecision::operator>
                              (&compare.epsiloncompare,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(__x_00->_vptr__Sp_counted_base + lVar43 * 0x10));
            pEVar20 = (ElementCompare *)(__x_00->_vptr__Sp_counted_base + lVar43 * 0x10);
            if (tVar7) {
              pEVar20 = &compare;
            }
            pEVar31 = pEVar20;
            ppiVar33 = &perm;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              *(uint *)ppiVar33 = (pEVar31->epsiloncompare).m_backend.data._M_elems[0];
              pEVar31 = (ElementCompare *)((long)pEVar31 + ((ulong)bVar44 * -2 + 1) * 4);
              ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
            }
            iStack_a58 = *(int *)(&(pEVar20->epsiloncompare).m_backend.data + 1);
            bStack_a54 = *(bool *)((long)(&(pEVar20->epsiloncompare).m_backend.data + 1) + 4);
            pfVar6 = (fpclass_type *)((long)(&(pEVar20->epsiloncompare).m_backend.data + 1) + 8);
            local_a50._0_4_ = *pfVar6;
            local_a50 = *(undefined8 *)pfVar6;
            tVar7 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_968,
                               (__x->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar43);
            pnVar21 = (__x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar43;
            if (tVar7) {
              pnVar21 = (pointer)local_968;
            }
            pnVar32 = pnVar21;
            pnVar34 = &local_a18;
            for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = (pnVar32->m_backend).data._M_elems[0];
              pnVar32 = (pointer)((long)pnVar32 + ((ulong)bVar44 * -2 + 1) * 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + (ulong)bVar44 * -8 + 4);
            }
            local_a18.m_backend.exp = (pnVar21->m_backend).exp;
            local_a18.m_backend.neg = (pnVar21->m_backend).neg;
            local_a18.m_backend.fpclass = (pnVar21->m_backend).fpclass;
            local_a18.m_backend.fpclass = (pnVar21->m_backend).fpclass;
            local_a18.m_backend.prec_elem = (pnVar21->m_backend).prec_elem;
            if (uVar27 == local_988) {
              DataArray<int>::DataArray((DataArray<int> *)&factor,n,0,1.2);
              for (uVar41 = 0; uVar19 != uVar41; uVar41 = uVar41 + 1) {
                *(int *)(factor.m_backend.data._M_elems._8_8_ + uVar41 * 4) = perm_tmp[uVar41];
              }
              pDVar14 = (DuplicateRowsPS *)operator_new(0x148);
              dupRows = (this->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_988;
              Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)&local_6c8,&scale);
              DataArray<int>::DataArray
                        ((DataArray<int> *)(local_6f8 + 0x18),(DataArray<int> *)&factor);
              DataArray<bool>::DataArray((DataArray<bool> *)local_6f8,&isLhsEqualRhs);
              lVar23 = 0x1c;
              ppiVar33 = &perm;
              pnVar34 = &local_330;
              for (lVar42 = lVar23; lVar42 != 0; lVar42 = lVar42 + -1) {
                (pnVar34->m_backend).data._M_elems[0] = *(uint *)ppiVar33;
                ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
                pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
              }
              local_330.m_backend.exp = iStack_a58;
              local_330.m_backend.neg = bStack_a54;
              local_330.m_backend.fpclass = (fpclass_type)local_a50;
              local_330.m_backend.prec_elem = local_a50._4_4_;
              pnVar34 = &local_a18;
              pnVar37 = &local_3b0;
              for (; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar37->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
                pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
                pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar37 + ((ulong)bVar44 * -2 + 1) * 4);
              }
              local_3b0.m_backend.exp = local_a18.m_backend.exp;
              local_3b0.m_backend.neg = local_a18.m_backend.neg;
              local_3b0.m_backend.fpclass = local_a18.m_backend.fpclass;
              local_3b0.m_backend.prec_elem = local_a18.m_backend.prec_elem;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_6b0,
                         local_bb8);
              RVar4 = Tolerances::epsilon((Tolerances *)local_6b0._0_8_);
              bVar9 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (&local_330,&local_3b0,RVar4);
              isLhsEqualRhs_01._1_7_ = 0;
              isLhsEqualRhs_01.thesize._0_1_ = (int)uVar40 == (int)uVar11;
              uVar45 = 0x40e524;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_750,local_bb8);
              scale_01.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_6f8 + 0x18);
              scale_01.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_6c8;
              scale_01.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_6f8;
              perm_01.data._0_1_ = bVar9;
              perm_01.thesize = 1;
              perm_01.themax = 0;
              perm_01.data._1_7_ = 0;
              perm_01.memFactor = (Real)&local_750;
              isLhsEqualRhs_01.data = (bool *)uVar45;
              isLhsEqualRhs_01.memFactor._0_4_ = in_stack_fffffffffffff408;
              isLhsEqualRhs_01.memFactor._4_4_ = iVar22;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi = _Var49._M_pi;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)pDVar14;
              DuplicateRowsPS::DuplicateRowsPS
                        (pDVar14,pSVar46,iVar22,local_bbc,local_bc0,dupRows,scale_01,perm_01,
                         isLhsEqualRhs_01,SUB81(pSVar46,0),SUB81(__x,0),tols_00,SUB81(pSVar50,0));
              std::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              ::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          *)&ptr,pDVar14);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_750._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6b0 + 8));
              DataArray<bool>::~DataArray((DataArray<bool> *)local_6f8);
              DataArray<int>::~DataArray((DataArray<int> *)(local_6f8 + 0x18));
              std::
              _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::~_Vector_base(&local_6c8);
              this = pSVar50;
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_990->data,(value_type *)&ptr);
              __x_00 = _Var49._M_pi;
              pSVar50 = this;
            }
            else {
              DataArray<int>::DataArray((DataArray<int> *)&factor,0,0,1.2);
              pDVar14 = (DuplicateRowsPS *)operator_new(0x148);
              pDVar12 = (this->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)&local_710,&scale);
              DataArray<int>::DataArray
                        ((DataArray<int> *)(local_740 + 0x18),(DataArray<int> *)&factor);
              DataArray<bool>::DataArray((DataArray<bool> *)local_740,&isLhsEqualRhs);
              lVar23 = 0x1c;
              ppiVar33 = &perm;
              pnVar34 = &local_430;
              for (lVar42 = lVar23; lVar42 != 0; lVar42 = lVar42 + -1) {
                (pnVar34->m_backend).data._M_elems[0] = *(uint *)ppiVar33;
                ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
                pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
              }
              local_430.m_backend.exp = iStack_a58;
              local_430.m_backend.neg = bStack_a54;
              local_430.m_backend.fpclass = (fpclass_type)local_a50;
              local_430.m_backend.prec_elem = local_a50._4_4_;
              pnVar34 = &local_a18;
              pnVar37 = &local_4b0;
              for (; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar37->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
                pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
                pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar37 + ((ulong)bVar44 * -2 + 1) * 4);
              }
              local_4b0.m_backend.exp = local_a18.m_backend.exp;
              local_4b0.m_backend.neg = local_a18.m_backend.neg;
              local_4b0.m_backend.fpclass = local_a18.m_backend.fpclass;
              local_4b0.m_backend.prec_elem = local_a18.m_backend.prec_elem;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_6b0,
                         local_bb8);
              RVar4 = Tolerances::epsilon((Tolerances *)local_6b0._0_8_);
              bVar9 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                (&local_430,&local_4b0,RVar4);
              uVar45 = 0x40e308;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_760,local_bb8);
              isLhsEqualRhs_00._1_7_ = 0;
              isLhsEqualRhs_00.thesize._0_1_ = uVar27 == local_8d8;
              scale_00.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_740 + 0x18);
              scale_00.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_710;
              scale_00.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_740;
              auVar5 = ZEXT116(bVar9) << 0x40;
              perm_00.memFactor = (Real)&local_760;
              perm_00.thesize = auVar5._0_4_;
              perm_00.themax = auVar5._4_4_;
              perm_00.data = (int *)auVar5._8_8_;
              isLhsEqualRhs_00.data = (bool *)uVar45;
              isLhsEqualRhs_00.memFactor._0_4_ = in_stack_fffffffffffff408;
              isLhsEqualRhs_00.memFactor._4_4_ = iVar22;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = _Var49._M_pi;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)pDVar14;
              DuplicateRowsPS::DuplicateRowsPS
                        (pDVar14,pSVar46,iVar22,local_bbc,local_bc0,
                         (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)((long)&pDVar12->_vptr_DSVectorBase + lVar15),scale_00,perm_00,
                         isLhsEqualRhs_00,SUB81(pSVar46,0),SUB81(__x,0),tols,SUB81(pSVar50,0));
              std::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              ::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          *)&ptr,pDVar14);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_760._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6b0 + 8));
              DataArray<bool>::~DataArray((DataArray<bool> *)local_740);
              DataArray<int>::~DataArray((DataArray<int> *)(local_740 + 0x18));
              std::
              _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::~_Vector_base(&local_710);
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_990->data,(value_type *)&ptr);
              __x_00 = _Var49._M_pi;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            DataArray<int>::~DataArray((DataArray<int> *)&factor);
            tVar7 = boost::multiprecision::operator>
                              (&compare.epsiloncompare,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(__x_00->_vptr__Sp_counted_base + lVar43 * 0x10));
            if (!tVar7) {
              tVar7 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)local_968,
                                 (__x->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar43);
              bVar9 = true;
              if (!tVar7) goto LAB_0040e7f5;
            }
            lVar23 = 0x1c;
            pnVar34 = &local_a18;
            pnVar37 = &local_530;
            for (lVar42 = lVar23; lVar42 != 0; lVar42 = lVar42 + -1) {
              (pnVar37->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + (ulong)bVar44 * -8 + 4);
              pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar37 + ((ulong)bVar44 * -2 + 1) * 4);
            }
            local_530.m_backend.exp = local_a18.m_backend.exp;
            local_530.m_backend.neg = local_a18.m_backend.neg;
            local_530.m_backend.fpclass = local_a18.m_backend.fpclass;
            local_530.m_backend.prec_elem = local_a18.m_backend.prec_elem;
            ppiVar33 = &perm;
            pnVar34 = &local_5b0;
            for (; lVar23 != 0; lVar23 = lVar23 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *(uint *)ppiVar33;
              ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
            }
            local_5b0.m_backend.exp = iStack_a58;
            local_5b0.m_backend.neg = bStack_a54;
            local_5b0.m_backend.fpclass = (fpclass_type)local_a50;
            local_5b0.m_backend.prec_elem = local_a50._4_4_;
            feastol(&local_1b0,this);
            bVar8 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_530,&local_5b0,&local_1b0);
            if (bVar8) {
              free(perm_tmp);
              perm_tmp = (int *)0x0;
              bVar8 = true;
              bVar9 = false;
            }
            else {
              tVar7 = boost::multiprecision::operator<
                                (&local_a18,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&perm);
              if (tVar7) {
                ppiVar33 = &perm;
                pnVar34 = &local_a18;
                for (lVar23 = 0x1c; lVar23 != 0; lVar23 = lVar23 + -1) {
                  (pnVar34->m_backend).data._M_elems[0] = *(uint *)ppiVar33;
                  ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
                  pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar34 + (ulong)bVar44 * -8 + 4);
                }
                local_a18.m_backend.exp = iStack_a58;
                local_a18.m_backend.neg = bStack_a54;
                local_a18.m_backend.fpclass = (fpclass_type)local_a50;
                local_a18.m_backend.prec_elem = local_a50._4_4_;
              }
              lVar23 = 0x1c;
              ppiVar33 = &perm;
              pnVar21 = newLhsVec.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar43;
              for (lVar42 = lVar23; lVar42 != 0; lVar42 = lVar42 + -1) {
                (pnVar21->m_backend).data._M_elems[0] = *(uint *)ppiVar33;
                ppiVar33 = (int **)((long)ppiVar33 + (ulong)bVar44 * -8 + 4);
                pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar44 * -2 + 1) * 4);
              }
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.exp = iStack_a58;
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.neg = bStack_a54;
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.fpclass =
                   (fpclass_type)local_a50;
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.prec_elem =
                   local_a50._4_4_;
              pnVar34 = &local_a18;
              pnVar21 = newRhsVec.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar43;
              for (; lVar23 != 0; lVar23 = lVar23 + -1) {
                (pnVar21->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
                pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar34 + ((ulong)bVar44 * -2 + 1) * 4);
                pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar44 * -2 + 1) * 4);
              }
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.exp =
                   local_a18.m_backend.exp;
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.neg =
                   local_a18.m_backend.neg;
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.fpclass =
                   local_a18.m_backend.fpclass;
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar43].m_backend.prec_elem =
                   local_a18.m_backend.prec_elem;
              bVar9 = true;
              bVar8 = true;
            }
          }
LAB_0040e7f5:
          DataArray<bool>::~DataArray(&isLhsEqualRhs);
          if (!bVar9) goto LAB_0040ea6a;
        }
      }
      pSVar47 = pSVar46;
      if (bVar8) {
        (*(pSVar46->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x38])(pSVar46,&newLhsVec,&newRhsVec,0);
        uVar41 = (ulong)(uint)(pSVar46->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,(int)uVar41);
      pIVar38 = (pSVar46->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      pDVar2 = (pSVar46->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      uVar19 = 0;
      uVar11 = uVar41 & 0xffffffff;
      if ((int)uVar41 < 1) {
        uVar11 = uVar19;
      }
      iVar22 = 0;
      for (uVar27 = 0; iVar24 = (int)uVar19, uVar11 != uVar27; uVar27 = uVar27 + 1) {
        if (remRow.data[uVar27] == true) {
          perm[uVar27] = -1;
          remRows = iVar24 + 1;
          uVar19 = (ulong)(uint)remRows;
          iVar22 = iVar22 + pIVar38[pDVar2[uVar27].idx].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
        }
        else {
          perm[uVar27] = 0;
        }
      }
      (*(pSVar47->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x11])(pSVar47,perm);
      piVar39 = (pSVar50->m_rIdx).data;
      for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
        if (-1 < (long)perm[uVar19]) {
          piVar39[perm[uVar19]] = piVar39[uVar19];
        }
      }
      free(perm);
      perm = (int *)0x0;
      free(perm_tmp);
      perm_tmp = (int *)0x0;
      if (iVar24 + iVar22 != 0 && SCARRY4(iVar24,iVar22) == iVar24 + iVar22 < 0) {
        piVar39 = &(pSVar50->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remRows;
        *piVar39 = *piVar39 + iVar24;
        piVar39 = &(pSVar50->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remNzos;
        *piVar39 = *piVar39 + iVar22;
        pSVar10 = (pSVar50->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar10 != (SPxOut *)0x0) && (3 < (int)pSVar10->m_verbosity)) {
          compare.epsiloncompare.m_backend.data._M_elems[0] = pSVar10->m_verbosity;
          local_968._0_4_ = 4;
          (*pSVar10->_vptr_SPxOut[2])();
          pSVar10 = soplex::operator<<((pSVar50->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (duplicate rows) removed ");
          pSVar10 = soplex::operator<<(pSVar10,iVar24);
          pSVar10 = soplex::operator<<(pSVar10," rows, ");
          pSVar10 = soplex::operator<<(pSVar10,iVar22);
          pSVar10 = soplex::operator<<(pSVar10," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
          pSVar10 = (pSVar50->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar10->_vptr_SPxOut[2])(pSVar10,&compare);
        }
        compare.epsiloncompare.m_backend.fpclass = cpp_dec_float_finite;
        compare.epsiloncompare.m_backend.prec_elem = 0x1c;
        compare.epsiloncompare.m_backend.data._M_elems[0] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[1] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[2] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[3] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[4] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[5] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[6] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[7] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[8] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[9] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[10] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xb] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xc] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xd] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xe] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0xf] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x18] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x19] = 0;
        compare.epsiloncompare.m_backend.data._M_elems._104_5_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        compare.epsiloncompare.m_backend.exp = 0;
        compare.epsiloncompare.m_backend.neg = false;
        compare.epsiloncompare.m_backend.data._M_elems[0x10] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x11] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x12] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x13] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x14] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x15] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x16] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[0x17] = 0;
        local_968 = (undefined1  [8])local_8d0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  ((cpp_dec_float<200U,_int,_void> *)&compare,
                   &(pSVar50->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend,(longlong *)local_968);
        tVar7 = boost::multiprecision::operator>(&remRows,&compare.epsiloncompare);
        if (tVar7) {
          *local_8e0 = true;
        }
      }
      local_ba8 = OKAY;
LAB_0040ea6a:
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&newRhsVec);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&newLhsVec);
      DataArray<bool>::~DataArray(&remRow);
      IdxSet::~IdxSet(&idxSet);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&scale);
      DataArray<int>::~DataArray(&classSize);
      DataArray<int>::~DataArray(&pClass);
    }
  }
  return local_ba8;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}